

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void int64_suite::fail_missing_two(void)

{
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [7];
  
  decoder.current.view._M_str._1_4_ = 0xd6;
  decoder.current.view._M_str._5_2_ = 0;
  decoder.current.view._M_str._7_1_ = 0;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[7]>
            ((decoder *)local_38,(uchar (*) [7])((long)&decoder.current.view._M_str + 1));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x231,"void int64_suite::fail_missing_two()",local_40,&local_44);
  return;
}

Assistant:

void fail_missing_two()
{
    const value_type input[] = { token::code::int64, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}